

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TIntermNode * __thiscall
glslang::HlslParseContext::handleReturnValue
          (HlslParseContext *this,TSourceLoc *loc,TIntermTyped *value)

{
  TType *pTVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TIntermBranch *pTVar4;
  
  (this->super_TParseContextBase).functionReturnsValue = true;
  iVar3 = (*((this->super_TParseContextBase).currentFunctionType)->_vptr_TType[7])();
  if (iVar3 == 0) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"void function cannot return a value","return","");
    pTVar4 = TIntermediate::addBranch
                       ((this->super_TParseContextBase).super_TParseVersions.intermediate,EOpReturn,
                        loc);
    return &pTVar4->super_TIntermNode;
  }
  pTVar1 = (this->super_TParseContextBase).currentFunctionType;
  iVar3 = (*(value->super_TIntermNode)._vptr_TIntermNode[0x1e])(value);
  bVar2 = TType::operator==(pTVar1,(TType *)CONCAT44(extraout_var,iVar3));
  if (!bVar2) {
    value = TIntermediate::addConversion
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate,EOpReturn,
                       (this->super_TParseContextBase).currentFunctionType,value);
    if (value == (TIntermTyped *)0x0) {
      value = (TIntermTyped *)0x0;
    }
    else {
      pTVar1 = (this->super_TParseContextBase).currentFunctionType;
      iVar3 = (*(value->super_TIntermNode)._vptr_TIntermNode[0x1e])(value);
      bVar2 = TType::operator==(pTVar1,(TType *)CONCAT44(extraout_var_00,iVar3));
      if (!bVar2) {
        value = TIntermediate::addUniShapeConversion
                          ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                           EOpReturn,(this->super_TParseContextBase).currentFunctionType,value);
      }
    }
    if (value != (TIntermTyped *)0x0) {
      pTVar1 = (this->super_TParseContextBase).currentFunctionType;
      iVar3 = (*(value->super_TIntermNode)._vptr_TIntermNode[0x1e])(value);
      bVar2 = TType::operator==(pTVar1,(TType *)CONCAT44(extraout_var_01,iVar3));
      if (bVar2) goto LAB_00387bc3;
    }
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"type does not match, or is not convertible to, the function\'s return type"
               ,"return","");
    return &value->super_TIntermNode;
  }
LAB_00387bc3:
  pTVar4 = TIntermediate::addBranch
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,EOpReturn,
                      value,loc);
  return &pTVar4->super_TIntermNode;
}

Assistant:

TIntermNode* HlslParseContext::handleReturnValue(const TSourceLoc& loc, TIntermTyped* value)
{
    functionReturnsValue = true;

    if (currentFunctionType->getBasicType() == EbtVoid) {
        error(loc, "void function cannot return a value", "return", "");
        return intermediate.addBranch(EOpReturn, loc);
    } else if (*currentFunctionType != value->getType()) {
        value = intermediate.addConversion(EOpReturn, *currentFunctionType, value);
        if (value && *currentFunctionType != value->getType())
            value = intermediate.addUniShapeConversion(EOpReturn, *currentFunctionType, value);
        if (value == nullptr || *currentFunctionType != value->getType()) {
            error(loc, "type does not match, or is not convertible to, the function's return type", "return", "");
            return value;
        }
    }

    return intermediate.addBranch(EOpReturn, value, loc);
}